

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.hpp
# Opt level: O1

LogicalAggregate * __thiscall
duckdb::LogicalOperator::Cast<duckdb::LogicalAggregate>(LogicalOperator *this)

{
  InternalException *this_00;
  string local_40;
  
  if (this->type == LOGICAL_AGGREGATE_AND_GROUP_BY) {
    return (LogicalAggregate *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Failed to cast logical operator to type - logical operator type mismatch","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (TARGET::TYPE != LogicalOperatorType::LOGICAL_INVALID && type != TARGET::TYPE) {
			throw InternalException("Failed to cast logical operator to type - logical operator type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}